

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImageLoader::load_runtime_symtab_from_gsym(CVmImageLoader *this,ulong siz)

{
  CVmImageLoader *pCVar1;
  undefined2 uVar2;
  CVmRuntimeSymbols *pCVar3;
  ulong len;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  char buf [208];
  vm_val_t local_120;
  CVmImageLoader *local_110;
  undefined1 local_108 [4];
  undefined2 local_104;
  
  if (this->runtime_symtab_ == (CVmRuntimeSymbols *)0x0) {
    pCVar3 = (CVmRuntimeSymbols *)operator_new(0x18);
    pCVar3->head_ = (vm_runtime_sym *)0x0;
    pCVar3->tail_ = (vm_runtime_sym *)0x0;
    pCVar3->cnt_ = 0;
    this->runtime_symtab_ = pCVar3;
  }
  if (3 < siz) {
    (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_108,4);
    uVar7 = (ulong)(uint)local_108;
    if (uVar7 != 0) {
      uVar5 = siz - 4;
      local_110 = this;
      do {
        if (uVar5 < 6) goto LAB_0029f1a1;
        uVar6 = uVar5 - 6;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_108,6);
        uVar2 = local_104;
        pCVar1 = local_110;
        len = (ulong)(ushort)local_108._0_2_;
        uVar4 = (ushort)local_108._2_2_ + len;
        if (0x50 < len) {
          uVar5 = uVar6 - uVar4;
          if (uVar4 <= uVar6) {
            (*this->fp_->_vptr_CVmImageFile[9])(this->fp_,uVar4);
            goto LAB_0029f183;
          }
          goto LAB_0029f1a1;
        }
        if ((uint)uVar4 < 0xd1) {
          uVar5 = uVar6 - uVar4;
          if (uVar6 < uVar4) goto LAB_0029f1a1;
          (*local_110->fp_->_vptr_CVmImageFile[3])(local_110->fp_,local_108,uVar4);
        }
        else {
          if (uVar6 < 0xd0) goto LAB_0029f1a1;
          uVar6 = uVar5 - 0xd6;
          (*local_110->fp_->_vptr_CVmImageFile[3])(local_110->fp_,local_108,0xd0);
          uVar4 = uVar4 - 0xd0;
          uVar5 = uVar6 - uVar4;
          if (uVar6 < uVar4) goto LAB_0029f1a1;
          (*pCVar1->fp_->_vptr_CVmImageFile[9])(pCVar1->fp_,uVar4);
        }
        this = local_110;
        switch(uVar2) {
        case 1:
          local_120.val.obj = (vm_obj_id_t)*(anon_struct_4_2_5f0bc21f_for_bifptr *)(local_108 + len)
          ;
          local_120.typ = VM_FUNCPTR;
          break;
        case 2:
          local_120.val.obj = (vm_obj_id_t)*(anon_struct_4_2_5f0bc21f_for_bifptr *)(local_108 + len)
          ;
          goto LAB_0029f15a;
        case 3:
          local_120.typ = VM_PROP;
          local_120.val.prop = *(unsigned_short *)(local_108 + len);
          break;
        default:
          local_120.typ = VM_EMPTY;
          break;
        case 6:
          local_120.typ = VM_BIFPTR;
          auVar8 = pshuflw(ZEXT416(*(uint *)(local_108 + len)),ZEXT416(*(uint *)(local_108 + len)),
                           0xe1);
          local_120.val.obj = auVar8._0_4_;
          break;
        case 9:
          local_120.val.obj =
               (vm_obj_id_t)*(anon_struct_4_2_5f0bc21f_for_bifptr *)(local_108 + len + 2);
LAB_0029f15a:
          local_120.typ = VM_OBJ;
          break;
        case 10:
          local_120.val.obj = (vm_obj_id_t)*(anon_struct_4_2_5f0bc21f_for_bifptr *)(local_108 + len)
          ;
          local_120.typ = VM_ENUM;
        }
        if (local_120.typ != VM_EMPTY) {
          CVmRuntimeSymbols::add_sym(local_110->runtime_symtab_,local_108,len,&local_120);
        }
LAB_0029f183:
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    return;
  }
LAB_0029f1a1:
  err_throw(0x132);
}

Assistant:

void CVmImageLoader::load_runtime_symtab_from_gsym(VMG_ ulong siz)
{
    const size_t TOK_SYM_MAX_LEN = 80;
    char buf[TOK_SYM_MAX_LEN + 128];
    ulong cnt;

    /* allocate the symbol table if we haven't already done so */
    if (runtime_symtab_ == 0)
        runtime_symtab_ = new CVmRuntimeSymbols();

    /* read the symbol count */
    read_data(buf, 4, &siz);
    cnt = t3rp4u(buf);

    /* read the symbols and populate the symbol table */
    for ( ; cnt != 0 ; --cnt)
    {
        char *sym_name;
        size_t sym_len;
        size_t dat_len;
        tc_symtype_t sym_type;
        char *dat;
        vm_val_t val;

        /* read the symbol's length, extra data length, and type code */
        read_data(buf, 6, &siz);
        sym_len = osrp2(buf);
        dat_len = osrp2(buf + 2);
        sym_type = (tc_symtype_t)osrp2(buf + 4);

        /* check the lengths to make sure they don't overflow our buffer */
        if (sym_len > TOK_SYM_MAX_LEN)
        {
            /* 
             *   this symbol name is too long - skip the symbol and its
             *   extra data entirely 
             */
            skip_data(sym_len + dat_len, &siz);

            /* go on to the next symbol */
            continue;
        }
        else if (dat_len + sym_len > sizeof(buf))
        {
            /* 
             *   The extra data block is too long for our fixed buffer.
             *   Truncate the extra data so that we don't overflow our
             *   buffer, but proceed anyway with the truncated extra data.
             *   Note that we won't lose any data we care about, since any
             *   extra data beyond our buffer size is additional future
             *   format data that we don't know how to handle anyway.  By
             *   design, we're allowed to skip extra data that we don't know
             *   how to read.  
             */
            read_data(buf, sizeof(buf), &siz);

            /* skip the remainder of the extra data */
            skip_data(sym_len + dat_len - sizeof(buf), &siz);
        }
        else
        {
            /* read the symbol's name and its type-specific data */
            read_data(buf, sym_len + dat_len, &siz);
        }

        /* the symbol name is at the start of the buffer */
        sym_name = buf;

        /* get the pointer to the extra data (it comes after the name) */
        dat = buf + sym_len;

        /* create the new symbol table entry, depending on its type */
        switch(sym_type)
        {
        case TC_SYM_FUNC:
            /* set up the function pointer value */
            val.set_fnptr(t3rp4u(dat));
            break;

        case TC_SYM_OBJ:
            /* set up the object value */
            val.set_obj(t3rp4u(dat));
            break;

        case TC_SYM_PROP:
            /* set up the property value */
            val.set_propid(osrp2(dat));

            /* check the 'dictionary property' flag */
            if (dat_len >= 3 && (dat[0] & 0x01) != 0)
            {
                // $$$ it's a dictionary property
            }
            break;

        case TC_SYM_ENUM:
            /* set up the enum value */
            val.set_enum(t3rp4u(dat));

            /* check the 'enum token' flag */
            if (dat_len >= 5 && (dat[0] & 0x01) != 0)
            {
                // $$$ it's an 'enum token'
            }
            break;

        case TC_SYM_METACLASS:
            /* set up the metaclass object value */
            val.set_obj(t3rp4u(dat + 2));
            break;

        case TC_SYM_BIF:
            /* built-in function */
            val.set_bifptr(osrp2(dat + 2), osrp2(dat));
            break;

        default:
            /* 
             *   ignore other types; mark the value as 'empty' so we know we
             *   don't have anything to add to the table 
             */
            val.set_empty();
            break;
        }

        /* if we found a valid type, add it to the table */
        if (val.typ != VM_EMPTY)
            runtime_symtab_->add_sym(sym_name, sym_len, &val);
    }
}